

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O0

void clear_all_objects_selected(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_40;
  Am_Object current;
  Am_Object local_28;
  undefined1 local_20 [8];
  Am_Value_List all_objects;
  Am_Object *inter_local;
  
  all_objects.item = (Am_List_Item *)inter;
  Am_Object::Get_Owner(&local_28,(Am_Slot_Flags)inter);
  pAVar2 = Am_Object::Get(&local_28,0x82,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_20,pAVar2);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Am_Object(&local_40);
  Am_Value_List::Start((Am_Value_List *)local_20);
  while( true ) {
    bVar1 = Am_Value_List::Last((Am_Value_List *)local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pAVar2 = Am_Value_List::Get((Am_Value_List *)local_20);
    Am_Object::operator=(&local_40,pAVar2);
    Am_Object::Set(&local_40,0x172,false,1);
    Am_Value_List::Next((Am_Value_List *)local_20);
  }
  Am_Object::~Am_Object(&local_40);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_20);
  return;
}

Assistant:

void
clear_all_objects_selected(Am_Object &inter)
{
  Am_Value_List all_objects = inter.Get_Owner().Get(Am_GRAPHICAL_PARTS);
  Am_Object current;
  for (all_objects.Start(); !all_objects.Last(); all_objects.Next()) {
    current = all_objects.Get();
    Am_REPORT_SET_SEL_VALUE(true, inter, current, false);
    current.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
  }
}